

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

size_t duckdb_snappy::CompressFromIOVec
                 (iovec *iov,size_t iov_cnt,string *compressed,CompressionOptions options)

{
  size_t in_RAX;
  size_t *psVar1;
  pointer compressed_00;
  size_t uncompressed_length;
  bool bVar2;
  size_t compressed_length;
  
  psVar1 = &iov->iov_len;
  uncompressed_length = 0;
  while (bVar2 = iov_cnt != 0, iov_cnt = iov_cnt - 1, bVar2) {
    uncompressed_length = uncompressed_length + *psVar1;
    psVar1 = psVar1 + 2;
  }
  compressed_00 = (char *)0x0;
  compressed_length = in_RAX;
  std::__cxx11::string::resize((ulong)compressed);
  if (compressed->_M_string_length != 0) {
    compressed_00 = (compressed->_M_dataplus)._M_p;
  }
  RawCompressFromIOVec(iov,uncompressed_length,compressed_00,&compressed_length,options);
  std::__cxx11::string::erase((ulong)compressed,compressed_length);
  return compressed_length;
}

Assistant:

size_t CompressFromIOVec(const struct iovec* iov, size_t iov_cnt,
                         std::string* compressed, CompressionOptions options) {
  // Compute the number of bytes to be compressed.
  size_t uncompressed_length = 0;
  for (size_t i = 0; i < iov_cnt; ++i) {
    uncompressed_length += iov[i].iov_len;
  }

  // Pre-grow the buffer to the max length of the compressed output.
  STLStringResizeUninitialized(compressed, MaxCompressedLength(
      uncompressed_length));

  size_t compressed_length;
  RawCompressFromIOVec(iov, uncompressed_length, string_as_array(compressed),
                       &compressed_length, options);
  compressed->erase(compressed_length);
  return compressed_length;
}